

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macThread.c
# Opt level: O2

void * authenticateMAC(void *parameters)

{
  long *plVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  ThreefishKey_t *key;
  long lVar4;
  size_t __n;
  _Bool _Var5;
  int iVar6;
  chunk *pcVar7;
  uint64_t *header;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  long local_40;
  
  bVar10 = true;
  local_40 = 0;
  pcVar7 = (chunk *)0x0;
  bVar11 = false;
  while ((**(char **)((long)parameters + 8) == '\x01' && (**(int **)((long)parameters + 0x18) == 0))
        ) {
    if (pcVar7 == (chunk *)0x0) {
      pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x28));
      pcVar7 = front(*(queue **)((long)parameters + 0x38));
      if ((pcVar7 == (chunk *)0x0) ||
         (pcVar7 = front(*(queue **)((long)parameters + 0x38)), pcVar7 == (chunk *)0x0)) {
        pcVar7 = (chunk *)0x0;
      }
      else if (pcVar7->action != '\x06') {
        deque(*(queue **)((long)parameters + 0x38));
      }
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x28));
      if (pcVar7 != (chunk *)0x0) goto LAB_001054d2;
      pcVar7 = (chunk *)0x0;
      lVar9 = local_40;
    }
    else {
LAB_001054d2:
      if ((byte)(pcVar7->action - 5) < 2) break;
      if (bVar10) {
        key = *(ThreefishKey_t **)((long)parameters + 0x50);
        uVar8 = key->stateSize >> 3;
        header = (uint64_t *)calloc(2,uVar8);
        if (header == (uint64_t *)0x0) goto LAB_00105749;
        __n = uVar8 * 2;
        memcpy(header,pcVar7->data,__n);
        decryptHeader(key,header);
        _Var5 = checkHeader(header,*(uint64_t **)((long)parameters + 0x58),
                            **(SkeinSize_t **)((long)parameters + 0x50));
        if (!_Var5) {
          **(undefined4 **)((long)parameters + 0x18) = 0xfffffffb;
          destroyChunk(pcVar7);
          goto LAB_00105742;
        }
        local_40 = local_40 + __n;
        **(undefined1 **)((long)parameters + 0x10) = 1;
        free(header);
      }
      if (!bVar11) {
        lVar9 = *(long *)((long)parameters + 0x20);
        pcVar7->action = *(uint8_t *)(lVar9 + 0x1b0);
        skeinUpdate(*(SkeinCtx_t **)(lVar9 + 0x1a8),(uint8_t *)pcVar7->data,pcVar7->data_size);
        local_40 = local_40 + pcVar7->data_size;
        bVar11 = true;
      }
      _Var5 = queueIsFull(*(queue **)((long)parameters + 0x40));
      lVar9 = local_40;
      if (_Var5) {
        bVar10 = false;
      }
      else {
        while (_Var5 = queueIsFull(*(queue **)((long)parameters + 0x40)), _Var5) {
          nanosleep((timespec *)&wait_interval,(timespec *)0x0);
        }
        pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
        _Var5 = enque(pcVar7,*(queue **)((long)parameters + 0x40));
        bVar10 = false;
        if (_Var5) {
          pcVar7 = (chunk *)0x0;
          bVar11 = bVar10;
        }
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x30));
      }
    }
    local_40 = 0;
    if ((lVar9 != 0) &&
       (iVar6 = pthread_mutex_trylock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8))
       , local_40 = lVar9, iVar6 == 0)) {
      lVar4 = *(long *)((long)parameters + 0x48);
      plVar1 = (long *)(lVar4 + 0x18);
      *plVar1 = *plVar1 + lVar9;
      pthread_mutex_unlock(*(pthread_mutex_t **)(lVar4 + 8));
      local_40 = 0;
    }
  }
  lVar9 = *(long *)((long)parameters + 0x20);
  header = (uint64_t *)calloc(*(size_t *)(lVar9 + 0x1c0),1);
  if (header == (uint64_t *)0x0) {
LAB_00105749:
    **(undefined4 **)((long)parameters + 0x18) = 0xfffffff4;
    return (void *)0x0;
  }
  skeinFinal(*(SkeinCtx_t **)(lVar9 + 0x1a8),(uint8_t *)header);
  do {
    if ((**(char **)((long)parameters + 8) != '\x01') || (**(int **)((long)parameters + 0x18) != 0))
    goto LAB_00105735;
    pcVar7 = front(*(queue **)((long)parameters + 0x38));
    if (pcVar7 == (chunk *)0x0) {
      pcVar7 = (chunk *)0x0;
    }
    else {
      pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x28));
      pcVar7 = front(*(queue **)((long)parameters + 0x38));
      if (pcVar7 != (chunk *)0x0) {
        deque(*(queue **)((long)parameters + 0x38));
      }
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x28));
    }
  } while (pcVar7 == (chunk *)0x0);
  if (pcVar7->action == '\x06') {
    uVar8 = 0;
    while (*(ulong *)(*(long *)((long)parameters + 0x20) + 0x1c0) >> 3 != uVar8) {
      puVar2 = header + uVar8;
      puVar3 = pcVar7->data + uVar8;
      uVar8 = uVar8 + 1;
      if (*puVar2 != *puVar3) {
        **(undefined4 **)((long)parameters + 0x18) = 0xfffffff6;
        free(header);
        destroyChunk(pcVar7);
        return (void *)0x0;
      }
    }
    while (_Var5 = queueIsFull(*(queue **)((long)parameters + 0x40)), _Var5) {
      nanosleep((timespec *)&wait_interval,(timespec *)0x0);
    }
    pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
    _Var5 = queueDone(*(queue **)((long)parameters + 0x40));
    if (!_Var5) {
      **(undefined4 **)((long)parameters + 0x18) = 0xfffffff1;
      return (void *)0x0;
    }
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x30));
    destroyChunk(pcVar7);
  }
  else {
LAB_00105735:
    **(undefined4 **)((long)parameters + 0x18) = 0xfffffff6;
  }
LAB_00105742:
  free(header);
  return (void *)0x0;
}

Assistant:

void* authenticateMAC(void* parameters)
{
    pdebug("authenticateMAC()\n");
    bool header = true;
    bool maced = false;
    chunk* mac_chunk = NULL;    
    macParams* params = parameters;
    uint64_t mac_progress = 0;
 
    while (*(params->running) && *(params->error) == 0)
    {
        //get the next chunk
        if (mac_chunk == NULL)
        {
            pthread_mutex_lock(params->in_mutex);
            if (front(params->in) != NULL)
            {
                pdebug("*** attempting to deque chunk to mac ***\n");
                mac_chunk = front(params->in);
                if (mac_chunk != NULL && mac_chunk->action != MAC)
                { deque(params->in); } //if the operation succeeded deque the chunk
            }
            pthread_mutex_unlock(params->in_mutex);
        }

        //check for loop termination conditions
        if (mac_chunk != NULL && (mac_chunk->action == MAC ||
            mac_chunk->action == DONE))
        { break; }

        //check the header
        if (mac_chunk != NULL && header)
        {
            pdebug("*** checking header ***\n");
            const uint64_t block_byte_size = (params->tf_key->stateSize)/8;
            uint64_t* test_header = calloc(2, block_byte_size);

            if (test_header == NULL) //Sanity check 
            {
                *(params->error) = MEMORY_ALLOCATION_FAIL;
                return NULL;
            }
            /* test the header in a buffer so we can keep the original header encrypted
             * in memory*/
            memcpy(test_header, mac_chunk->data, 2*block_byte_size);
            decryptHeader(params->tf_key, test_header);

            if (!checkHeader(test_header, params->file_size, params->tf_key->stateSize))
            {
                pdebug("*** Header check failed ***\n");
                pdebug("*** Ran header check on chunk of size %lu ***\n", mac_chunk->data_size);
                *(params->error) = HEADER_CHECK_FAIL; //set the error flag
		        destroyChunk(mac_chunk); //free any resources that are not in the queue
                if (test_header != NULL) { free(test_header); }

                return NULL;
            }

            pdebug("*** Header check succeeded ***\n");
            header = false;
            mac_progress += 2*block_byte_size;
            //signal to other processes that the header is valid
            *(params->valid) = true;
             
            if (test_header != NULL) { free(test_header); }
        }

        if (mac_chunk != NULL && !maced) //mac the chunk
        {
            pdebug("*** Updating mac on chunk of size %lu ***\n", mac_chunk->data_size);
            mac_chunk->action = params->mac_context->out_action; 
            skeinUpdate(params->mac_context->skein_context_ptr,
                        (const uint8_t*)mac_chunk->data,
                        mac_chunk->data_size);

	        mac_progress += mac_chunk->data_size;
            maced = true;
        }

        //attempt to queue the chunk
        if (mac_chunk != NULL && maced && !queueIsFull(params->out))
        {
            pdebug("*** Queuing chunk of size %lu ***\n", mac_chunk->data_size);
	        while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); }
            
            pthread_mutex_lock(params->out_mutex);
            if (enque(mac_chunk, params->out))
            {
                maced = false;
                mac_chunk = NULL;
            }
            pthread_mutex_unlock(params->out_mutex);
        }
        
	    if (mac_progress > 0)
        {
	        if (pthread_mutex_trylock(params->progress->progress_mutex) == 0)
	        {
	            params->progress->progress += mac_progress;
		        mac_progress = 0;
		        pthread_mutex_unlock(params->progress->progress_mutex);
	        }
	    }
    } //end while loop

    pdebug("*** authenticateMAC() done with first loop ***\n");
    //allocates storage for the calculated mac
    uint64_t* calculated_mac = calloc(params->mac_context->digest_byte_size,
                                      sizeof(uint8_t));

    if (calculated_mac == NULL) //Sanity check 
    {
        *(params->error) = MEMORY_ALLOCATION_FAIL;

        return NULL;
    }
    
    pdebug("*** Calculating MAC ***\n"); 
    skeinFinal(params->mac_context->skein_context_ptr, (uint8_t*)calculated_mac);
    chunk* stored_mac_chunk = NULL;

    //attempt to get the MAC appended to the end of the file
    while (*(params->running) && *(params->error) == 0)
    {
        //dequeue the mac chunk
        if (stored_mac_chunk == NULL && front(params->in) != NULL)
        {
            pdebug("*** Reading stored MAC ***\n");
            pthread_mutex_lock(params->in_mutex);
            stored_mac_chunk = front(params->in);
            if (stored_mac_chunk != NULL) { deque(params->in); }
            pthread_mutex_unlock(params->in_mutex);
        }

        if (stored_mac_chunk != NULL) { break; } //check for the termination condition
    }

    if (stored_mac_chunk == NULL || stored_mac_chunk->action != MAC)
    {
        pdebug("*** Unable to queue stored mac chunk ***\n");
        *(params->error) = MAC_CHECK_FAIL;
        if (calculated_mac != NULL) { free(calculated_mac); }

        return NULL;
    }

    uint64_t* stored_mac = stored_mac_chunk->data; 

    //compare the calculated and stored mac return an error if they don't match
    for (size_t i=0; i<(params->mac_context->digest_byte_size/8); ++i)
    {
        if (calculated_mac[i] != stored_mac[i])
        {
            pdebug("*** MAC check failed. File has been tampered with or was not encrypted with this program ***\n");
            *(params->error) = MAC_CHECK_FAIL;
            free(calculated_mac);
            destroyChunk(stored_mac_chunk);

            return NULL;
        } //if control falls through the MAC is valid
    }

    pdebug("*** MAC check passed ***\n");
    //queue Done flag
    while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); } //wait until the queue is free 
    pthread_mutex_lock(params->out_mutex);
    if (!queueDone(params->out))
    {
        pdebug("Error queueing done\n");
        *(params->error) = QUEUE_OPERATION_FAIL;

        return NULL;
    }
    pthread_mutex_unlock(params->out_mutex);
    pdebug("*** Done queued *** \n");

    //free any remaining allocated resources
    if (stored_mac_chunk != NULL) { destroyChunk(stored_mac_chunk); }
    if (calculated_mac != NULL) { free(calculated_mac); }

    return NULL;
}